

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::AddWaitSemaphore
          (DeviceContextVkImpl *this,ManagedSemaphore *pWaitSemaphore,
          VkPipelineStageFlags WaitDstStageMask)

{
  char (*in_RCX) [26];
  string msg;
  VkPipelineStageFlags local_3c;
  ManagedSemaphore *local_38;
  string local_30;
  
  local_3c = WaitDstStageMask;
  local_38 = pWaitSemaphore;
  if (pWaitSemaphore == (ManagedSemaphore *)0x0) {
    FormatString<char[26],char[26]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pWaitSemaphore != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"AddWaitSemaphore",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
               ,0x154);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
  ::
  emplace_back<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>*&>
            ((vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
              *)&this->m_WaitManagedSemaphores,&local_38);
  local_30._M_dataplus._M_p = (pointer)(local_38->m_VkObject).m_VkObject;
  std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::emplace_back<VkSemaphore_T*>
            ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)&this->m_VkWaitSemaphores,
             (VkSemaphore_T **)&local_30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_WaitDstStageMasks,&local_3c);
  local_30._M_dataplus._M_p = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->m_WaitSemaphoreValues,(unsigned_long *)&local_30);
  return;
}

Assistant:

void AddWaitSemaphore(ManagedSemaphore* pWaitSemaphore, VkPipelineStageFlags WaitDstStageMask)
    {
        VERIFY_EXPR(pWaitSemaphore != nullptr);
        m_WaitManagedSemaphores.emplace_back(pWaitSemaphore);
        m_VkWaitSemaphores.push_back(pWaitSemaphore->Get());
        m_WaitDstStageMasks.push_back(WaitDstStageMask);
        m_WaitSemaphoreValues.push_back(0); // Ignored for binary semaphore
    }